

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O3

void Gia_ManPerformFlow2(int fIsMapped,int nAnds,int nLevels,int nLutSize,int nCutNum,int fBalance,
                        int fMinAve,int fUseMfs,int fVerbose)

{
  bool bVar1;
  Abc_Frame_t *pAVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  char Comm3 [1000];
  char Comm1 [1000];
  char Comm4 [1000];
  char local_fe8 [1008];
  char local_bf8 [1008];
  char local_808 [1008];
  char local_418 [1000];
  
  pcVar5 = "t";
  if (fMinAve == 0) {
    pcVar5 = "";
  }
  pcVar3 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
  if (fUseMfs == 0) {
    pcVar3 = "";
  }
  uVar4 = nCutNum + 4;
  if (nLutSize == 0) {
    sprintf(local_808,"&synch2 -K 6 -C 500;  &if -m%s       -C %d; %s &save",pcVar5,nCutNum,pcVar3);
    sprintf(local_fe8,"&dch -C 500;          &if -m%s       -C %d; %s &save",pcVar5,(ulong)uVar4,
            pcVar3);
    sprintf(local_bf8,"&synch2 -K 6 -C 500;  &lf -m%s  -E 5 -C %d; %s &save",pcVar5,nCutNum,pcVar3);
    sprintf(local_418,"&dch -C 500;          &lf -m%sk -E 5 -C %d; %s &save",pcVar5,(ulong)uVar4,
            pcVar3);
  }
  else {
    sprintf(local_808,"&synch2 -K %d -C 500; &if -m%s       -K %d -C %d; %s &save",
            (ulong)(uint)nLutSize,pcVar5,(ulong)(uint)nLutSize,nCutNum,pcVar3);
    sprintf(local_fe8,"&dch -C 500;          &if -m%s       -K %d -C %d; %s &save",pcVar5,
            (ulong)(uint)nLutSize,(ulong)uVar4,pcVar3);
    sprintf(local_bf8,"&synch2 -K %d -C 500; &lf -m%s  -E 5 -K %d -C %d; %s &save",
            (ulong)(uint)nLutSize,pcVar5,(ulong)(uint)nLutSize,nCutNum,pcVar3);
    sprintf(local_418,"&dch -C 500;          &lf -m%sk -E 5 -K %d -C %d; %s &save",pcVar5,
            (ulong)(uint)nLutSize,(ulong)uVar4,pcVar3);
  }
  if (fVerbose != 0) {
    puts("Trying synthesis...");
  }
  if (fIsMapped != 0) {
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"&st");
  }
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,local_808);
  pAVar2 = Abc_FrameGetGlobalFrame();
  if (fVerbose == 0) {
    Cmd_CommandExecute(pAVar2,"&st");
    pcVar5 = local_fe8;
  }
  else {
    pcVar5 = "&ps";
    Cmd_CommandExecute(pAVar2,"&ps");
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"&st");
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,local_fe8);
  }
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,pcVar5);
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,"&load");
  if (fVerbose == 0) {
    if (fBalance == 0) goto LAB_007b7cb2;
  }
  else {
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"&ps");
    if (fBalance == 0) {
LAB_007b7cb2:
      bVar1 = true;
      goto LAB_007b7cb5;
    }
    puts("Trying SOP balancing...");
  }
  bVar1 = false;
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,"&st; &sopb -R 10 -C 4");
LAB_007b7cb5:
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,local_bf8);
  pAVar2 = Abc_FrameGetGlobalFrame();
  if (fVerbose == 0) {
    Cmd_CommandExecute(pAVar2,"&st");
    pcVar5 = local_fe8;
  }
  else {
    pcVar5 = "&ps";
    Cmd_CommandExecute(pAVar2,"&ps");
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"&st");
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,local_fe8);
  }
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,pcVar5);
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,"&load");
  if (fVerbose != 0) {
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"&ps");
  }
  if (nAnds < 0x186a1) {
    if (!bVar1) {
      if (fVerbose != 0) {
        puts("Trying SOP balancing...");
      }
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,"&st; &sopb -R 10");
    }
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,local_bf8);
    pAVar2 = Abc_FrameGetGlobalFrame();
    if (fVerbose == 0) {
      Cmd_CommandExecute(pAVar2,"&st");
      pcVar5 = local_fe8;
    }
    else {
      pcVar5 = "&ps";
      Cmd_CommandExecute(pAVar2,"&ps");
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,"&st");
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,local_fe8);
    }
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,pcVar5);
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"&load");
    if (fVerbose != 0) {
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,"&ps");
    }
    if (nAnds < 0xc351) {
      if (!bVar1) {
        if (fVerbose != 0) {
          puts("Trying SOP balancing...");
        }
        pAVar2 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar2,"&st; &sopb -R 10");
      }
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,local_bf8);
      pAVar2 = Abc_FrameGetGlobalFrame();
      if (fVerbose == 0) {
        Cmd_CommandExecute(pAVar2,"&st");
        pcVar5 = local_fe8;
      }
      else {
        pcVar5 = "&ps";
        Cmd_CommandExecute(pAVar2,"&ps");
        pAVar2 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar2,"&st");
        pAVar2 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar2,local_fe8);
      }
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,pcVar5);
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,"&load");
      if (fVerbose != 0) {
        pAVar2 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar2,"&ps");
      }
    }
  }
  return;
}

Assistant:

void Gia_ManPerformFlow2( int fIsMapped, int nAnds, int nLevels, int nLutSize, int nCutNum, int fBalance, int fMinAve, int fUseMfs, int fVerbose )
{
    char Comm1[1000], Comm2[1000], Comm3[1000], Comm4[1000];
    if ( nLutSize == 0 ) 
    {
        sprintf( Comm1, "&synch2 -K 6 -C 500;  &if -m%s       -C %d; %s &save", fMinAve?"t":"", nCutNum,   fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm2, "&dch -C 500;          &if -m%s       -C %d; %s &save", fMinAve?"t":"", nCutNum+4, fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm3, "&synch2 -K 6 -C 500;  &lf -m%s  -E 5 -C %d; %s &save", fMinAve?"t":"", nCutNum,   fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm4, "&dch -C 500;          &lf -m%sk -E 5 -C %d; %s &save", fMinAve?"t":"", nCutNum+4, fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
    }
    else
    {
        sprintf( Comm1, "&synch2 -K %d -C 500; &if -m%s       -K %d -C %d; %s &save", nLutSize, fMinAve?"t":"", nLutSize, nCutNum,   fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm2, "&dch -C 500;          &if -m%s       -K %d -C %d; %s &save",           fMinAve?"t":"", nLutSize, nCutNum+4, fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm3, "&synch2 -K %d -C 500; &lf -m%s  -E 5 -K %d -C %d; %s &save", nLutSize, fMinAve?"t":"", nLutSize, nCutNum,   fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm4, "&dch -C 500;          &lf -m%sk -E 5 -K %d -C %d; %s &save",           fMinAve?"t":"", nLutSize, nCutNum+4, fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
    }

    // perform synthesis
    if ( fVerbose )
        printf( "Trying synthesis...\n" );
    if ( fIsMapped )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm1 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // return the result
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&load" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );


    // perform balancing
    if ( fBalance )
    {
        if ( fVerbose )
            printf( "Trying SOP balancing...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st; &sopb -R 10 -C 4" );
    }


    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // return the result
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&load" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    if ( nAnds > 100000 )
        return;


    // perform balancing
    if ( fBalance )
    {
        if ( fVerbose )
            printf( "Trying SOP balancing...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st; &sopb -R 10" );
    }


    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // return the result
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&load" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    if ( nAnds > 50000 )
        return;


    // perform balancing
    if ( fBalance )
    {
        if ( fVerbose )
            printf( "Trying SOP balancing...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st; &sopb -R 10" );
    }


    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // return the result
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&load" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
}